

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_find(HSQUIRRELVM v)

{
  SQOuter *this;
  SQTable *pSVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *o2;
  bool bVar4;
  SQObjectValue nidx;
  bool res;
  SQObjectPtr temp;
  bool local_59;
  SQObjectPtr local_58;
  HSQUIRRELVM local_48;
  SQObjectPtr local_40;
  
  pSVar3 = SQVM::GetAt(v,v->_stackbase);
  o2 = SQVM::GetAt(v,v->_stackbase + 1);
  this = (pSVar3->super_SQObject)._unVal.pOuter;
  pSVar1 = (SQTable *)this->_idx;
  local_58.super_SQObject._type = OT_NULL;
  local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((long)pSVar1 < 1) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    nidx.pTable = (SQTable *)0x0;
    local_48 = v;
    do {
      local_59 = false;
      SQArray::Get((SQArray *)this,nidx.nInteger,&local_58);
      bVar2 = SQVM::IsEqual(&local_58,o2,&local_59);
      if ((bVar2) && (local_59 == true)) {
        local_40.super_SQObject._type = OT_INTEGER;
        local_40.super_SQObject._unVal = nidx;
        SQVM::Push(local_48,&local_40);
        SQObjectPtr::~SQObjectPtr(&local_40);
        break;
      }
      nidx.pTable = (SQTable *)
                    ((long)&((nidx.pTable)->super_SQDelegable).super_SQCollectable.
                            super_SQRefCounted._vptr_SQRefCounted + 1);
      bVar4 = nidx.nInteger < (long)pSVar1;
    } while (nidx.pTable != pSVar1);
  }
  SQObjectPtr::~SQObjectPtr(&local_58);
  return (ulong)bVar4;
}

Assistant:

static SQInteger array_find(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQObjectPtr &val = stack_get(v,2);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr temp;
    for(SQInteger n = 0; n < size; n++) {
        bool res = false;
        a->Get(n,temp);
        if(SQVM::IsEqual(temp,val,res) && res) {
            v->Push(n);
            return 1;
        }
    }
    return 0;
}